

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O1

bool __thiscall
nuraft::raft_server::snapshot_and_compact
          (raft_server *this,ulong committed_idx,bool forced_creation)

{
  ulong uVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  long *plVar5;
  _func_int **pp_Var6;
  undefined8 this_00;
  thread tVar7;
  snapshot *psVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  unsigned_long uVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  buffer *buf;
  undefined4 extraout_var_02;
  int32 extraout_var_03;
  uint64_t uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int *p_Var13;
  bool bVar14;
  bool bVar15;
  handler_type handler;
  ptr<snapshot> new_snapshot;
  ptr<log_entry> conf_log;
  ulong log_term_to_compact;
  ptr<raft_params> params;
  ptr<snapshot> local_snp;
  _func_int **local_110;
  undefined1 local_108 [24];
  thread tStack_f0;
  thread local_e8;
  EventAwaiter *pEStack_e0;
  snapshot *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  __native_type _Stack_a8;
  unsigned_long local_80;
  undefined1 local_78 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_110 = (_func_int **)committed_idx;
  context::get_params((context *)local_78);
  get_config((raft_server *)local_108);
  uVar1 = *(ulong *)(local_108._0_8_ + 8);
  iVar11 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_vptr_log_store[2])();
  if (uVar1 < CONCAT44(extraout_var,iVar11)) {
    iVar11 = *(int *)&((element_type *)(local_78._0_8_ + 0x18))->_vptr_state_mgr;
    if ((*(char *)&((element_type *)(local_78._0_8_ + 0x20))->_vptr_state_mgr == '\x01') &&
       (((this->snp_in_progress_)._M_base._M_i & 1U) == 0)) {
      get_last_snapshot((raft_server *)local_58);
      bVar14 = true;
      bVar15 = true;
      if (local_58._0_8_ != 0) goto LAB_001991fd;
      bVar15 = *(int *)&((element_type *)(local_78._0_8_ + 0x18))->_vptr_state_mgr != 0;
    }
    else {
      bVar15 = false;
LAB_001991fd:
      bVar14 = bVar15;
      bVar15 = false;
    }
    if ((bVar14) &&
       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    pp_Var6 = local_110;
    p_Var13 = (_func_int *)(long)iVar11;
    if (bVar15) {
      p_Var13 = (_func_int *)(ulong)this->first_snapshot_distance_;
    }
    if ((forced_creation) ||
       (((*(int *)&((element_type *)(local_78._0_8_ + 0x18))->_vptr_state_mgr != 0 &&
         (iVar11 = (*((this->log_store_).
                      super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     _vptr_log_store[3])(),
         p_Var13 <= (_func_int *)((long)pp_Var6 + (1 - CONCAT44(extraout_var_00,iVar11))))) &&
        (iVar11 = (*((this->state_machine_).
                     super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_state_machine[0x13])(), (char)iVar11 != '\0')))) {
      get_last_snapshot((raft_server *)(local_78 + 0x10));
      if (((forced_creation) || ((element_type *)local_78._16_8_ == (element_type *)0x0)) ||
         (p_Var13 <= (_func_int *)((long)local_110 - (long)*(_func_int ***)local_78._16_8_))) {
        bVar15 = false;
        LOCK();
        bVar14 = (this->snp_in_progress_)._M_base._M_i == false;
        if (bVar14) {
          (this->snp_in_progress_)._M_base._M_i = true;
        }
        UNLOCK();
        if (bVar14) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 3 < iVar11)
             ) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_c8,"creating a snapshot for index %lu",local_110);
            (*peVar2->_vptr_logger[8])
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x209,local_c8);
            if ((log_entry *)local_c8._0_8_ != (log_entry *)local_b8) {
              operator_delete((void *)local_c8._0_8_);
            }
          }
          if (local_110 < *(_func_int ***)local_108._0_8_) {
            do {
              uVar1 = *(ulong *)(local_108._0_8_ + 8);
              iVar11 = (*((this->log_store_).
                          super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->_vptr_log_store[3])();
              if (uVar1 < CONCAT44(extraout_var_01,iVar11)) break;
              peVar3 = (this->log_store_).
                       super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              (*peVar3->_vptr_log_store[10])(local_c8,peVar3,*(ulong *)(local_108._0_8_ + 8));
              buf = log_entry::get_buf((log_entry *)local_c8._0_8_);
              cluster_config::deserialize((cluster_config *)(local_108 + 0x10),buf);
              tVar7._M_id._M_thread = tStack_f0._M_id._M_thread;
              local_108._0_8_ = local_108._16_8_;
              this_00 = local_108._8_8_;
              local_108._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              tStack_f0._M_id._M_thread = (id)0;
              local_108._8_8_ = tVar7._M_id._M_thread;
              if ((element_type *)this_00 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
              }
              if (tStack_f0._M_id._M_thread != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tStack_f0._M_id._M_thread
                          );
              }
              if (local_c8._8_8_ != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
              }
            } while (local_110 < *(_func_int ***)local_108._0_8_);
          }
          if (((local_110 < *(_func_int ***)local_108._0_8_) &&
              (uVar1 = *(ulong *)(local_108._0_8_ + 8), uVar1 != 0)) &&
             (iVar11 = (*((this->log_store_).
                          super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                         ->_vptr_log_store[3])(), uVar1 < CONCAT44(extraout_var_02,iVar11))) {
            if ((element_type *)local_78._16_8_ == (element_type *)0x0) {
              peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if ((peVar2 != (element_type *)0x0) &&
                 (iVar11 = (*peVar2->_vptr_logger[7])(), 1 < iVar11)) {
                peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                msg_if_given_abi_cxx11_
                          ((string *)local_c8,
                           "No snapshot could be found while no configuration cannot be found in current committed logs, this is a system error, exiting"
                          );
                (*peVar2->_vptr_logger[8])
                          (peVar2,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                           ,"snapshot_and_compact",0x219,local_c8);
                if ((log_entry *)local_c8._0_8_ != (log_entry *)local_b8) {
                  operator_delete((void *)local_c8._0_8_);
                }
              }
              plVar5 = *(long **)&(((this->ctx_)._M_t.
                                    super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                    .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                                  state_mgr_).
                                  super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
              (**(code **)(*plVar5 + 0x40))(plVar5,0xfffffffa);
              exit(-1);
            }
            local_108._0_8_ = ((element_type *)(local_78._16_8_ + 0x18))->_vptr_state_machine;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78._16_8_ + 0x20));
          }
          else if (((local_110 < *(_func_int ***)local_108._0_8_) &&
                   (*(ulong *)(local_108._0_8_ + 8) == 0)) &&
                  ((peVar2 = (this->l_).
                             super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   peVar2 != (element_type *)0x0 &&
                   (iVar11 = (*peVar2->_vptr_logger[7])(), 2 < iVar11)))) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_c8,
                       "config at log idx 1 is not availabe, config log idx %lu, prev log idx %lu, committed idx %lu"
                       ,*(_func_int ***)local_108._0_8_,*(ulong *)(local_108._0_8_ + 8),local_110);
            (*peVar2->_vptr_logger[8])
                      (peVar2,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x22a,local_c8);
            if ((log_entry *)local_c8._0_8_ != (log_entry *)local_b8) {
              operator_delete((void *)local_c8._0_8_);
            }
          }
          peVar3 = (this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar11 = (*peVar3->_vptr_log_store[0xb])(peVar3,local_110);
          local_80 = CONCAT44(extraout_var_03,iVar11);
          local_d8 = (snapshot *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<nuraft::snapshot,std::allocator<nuraft::snapshot>,unsigned_long&,unsigned_long&,std::shared_ptr<nuraft::cluster_config>&>
                    (&local_d0,&local_d8,(allocator<nuraft::snapshot> *)(local_108 + 0x10),
                     (unsigned_long *)&local_110,&local_80,
                     (shared_ptr<nuraft::cluster_config> *)local_108);
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar2 != (element_type *)0x0) && (iVar11 = (*peVar2->_vptr_logger[7])(), 3 < iVar11)
             ) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)local_c8,"create snapshot idx %lu log_term %lu",local_110,local_80)
            ;
            (*peVar2->_vptr_logger[8])
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x234,local_c8);
            if ((log_entry *)local_c8._0_8_ != (log_entry *)local_b8) {
              operator_delete((void *)local_c8._0_8_);
            }
          }
          _Var9._M_pi = local_d0._M_pi;
          psVar8 = local_d8;
          if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
            }
          }
          local_e8._M_id._M_thread = (id)0;
          pEStack_e0 = (EventAwaiter *)0x0;
          local_108._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          tStack_f0._M_id._M_thread = (id)0;
          local_108._16_8_ = operator_new(0x28);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_)->_vptr__Sp_counted_base
               = (_func_int **)on_snapshot_completed;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_)->_M_use_count = 0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._16_8_)->_M_weak_count = 0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_108._16_8_ + 0x10))->
          _vptr__Sp_counted_base = (_func_int **)psVar8;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_108._16_8_ + 0x10))->
            _M_use_count = _Var9._M_pi;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_108._16_8_ + 0x20))->
          _vptr__Sp_counted_base = (_func_int **)this;
          pEStack_e0 = (EventAwaiter *)
                       std::
                       _Function_handler<void_(bool_&,_std::shared_ptr<std::exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::snapshot>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>_&,_bool,_std::shared_ptr<std::exception>_&)>_>
                       ::_M_invoke;
          local_e8._M_id._M_thread =
               (id)std::
                   _Function_handler<void_(bool_&,_std::shared_ptr<std::exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::snapshot>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::snapshot>_&,_bool,_std::shared_ptr<std::exception>_&)>_>
                   ::_M_manager;
          local_c8._0_8_ = (log_entry *)0x0;
          local_c8._8_8_ = 0;
          local_b8[0] = '\x01';
          local_b8._8_8_ = 0;
          _Stack_a8.__align = 0;
          _Stack_a8._8_8_ = 0;
          _Stack_a8._16_8_ = 0;
          _Stack_a8.__data.__list.__prev = (__pthread_internal_list *)0x0;
          timer_helper::reset((timer_helper *)local_c8);
          peVar4 = (this->state_machine_).
                   super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (*peVar4->_vptr_state_machine[0x12])(peVar4,local_d8,local_108 + 0x10);
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar2 != (element_type *)0x0) &&
             (iVar11 = (*peVar2->_vptr_logger[7])(), uVar10 = local_80, pp_Var6 = local_110,
             3 < iVar11)) {
            peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            uVar12 = timer_helper::get_us((timer_helper *)local_c8);
            msg_if_given_abi_cxx11_
                      ((string *)(local_58 + 0x10),
                       "create snapshot idx %lu log_term %lu done: %lu us elapsed",pp_Var6,uVar10,
                       uVar12);
            (*peVar2->_vptr_logger[8])
                      (peVar2,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"snapshot_and_compact",0x240,local_58 + 0x10);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._16_8_ != &local_38) {
              operator_delete((void *)local_58._16_8_);
            }
          }
          if (local_e8._M_id._M_thread != 0) {
            (*(code *)local_e8._M_id._M_thread)(local_108 + 0x10,local_108 + 0x10,3);
          }
          if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
          }
          bVar15 = true;
        }
      }
      else {
        bVar15 = false;
      }
      if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
      }
      goto LAB_001996c4;
    }
  }
  bVar15 = false;
LAB_001996c4:
  if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  return bVar15;
}

Assistant:

bool raft_server::snapshot_and_compact(ulong committed_idx, bool forced_creation) {
    ptr<raft_params> params = ctx_->get_params();

    // get the latest configuration info
    ptr<cluster_config> conf = get_config();
    if ( conf->get_prev_log_idx() >= log_store_->next_slot() ) {
        // The latest config and previous config is not in log_store,
        // so skip the snapshot creation.
        return false;
    }

    auto snapshot_distance = (ulong)params->snapshot_distance_;
    // Randomized snapshot distance for the first creation.
    if ( params->enable_randomized_snapshot_creation_ &&
         !snp_in_progress_.load(std::memory_order_relaxed) &&
         !get_last_snapshot() &&
         params->snapshot_distance_ != 0 ) {
        snapshot_distance = first_snapshot_distance_;
    }

    if (!forced_creation) {
        // If `forced_creation == true`, ignore below conditions.
        if ( params->snapshot_distance_ == 0 ||
             ( committed_idx - log_store_->start_index() + 1 ) < snapshot_distance ) {
            // snapshot is disabled or the log store is not long enough
            return false;
        }

        if ( !state_machine_->chk_create_snapshot() ) {
            // User-defined state machine doesn't want to create a snapshot.
            return false;
        }
    }

    bool snapshot_in_action = false;
 try {
    bool f = false;
    ptr<snapshot> local_snp = get_last_snapshot();
    if ( ( forced_creation ||
           !local_snp ||
           ( committed_idx - local_snp->get_last_log_idx() ) >= snapshot_distance ) &&
         snp_in_progress_.compare_exchange_strong(f, true) )
    {
        snapshot_in_action = true;
        p_in("creating a snapshot for index %" PRIu64 "", committed_idx);

        while ( conf->get_log_idx() > committed_idx &&
                conf->get_prev_log_idx() >= log_store_->start_index() ) {
            ptr<log_entry> conf_log
                ( log_store_->entry_at( conf->get_prev_log_idx() ) );
            conf = cluster_config::deserialize(conf_log->get_buf());
        }

        if ( conf->get_log_idx() > committed_idx &&
             conf->get_prev_log_idx() > 0 &&
             conf->get_prev_log_idx() < log_store_->start_index() ) {
            if (!local_snp) {
                // LCOV_EXCL_START
                p_er("No snapshot could be found while no configuration "
                     "cannot be found in current committed logs, "
                     "this is a system error, exiting");
                ctx_->state_mgr_->system_exit(raft_err::N6_no_snapshot_found);
                ::exit(-1);
                return false;
                // LCOV_EXCL_STOP
            }
            conf = local_snp->get_last_config();

        } else if ( conf->get_log_idx() > committed_idx &&
                    conf->get_prev_log_idx() == 0 ) {
            // Modified by Jung-Sang Ahn in May, 2018:
            //  Since we remove configure from state machine
            //  (necessary when we clone a node to another node),
            //  config at log idx 1 may not be visiable in some condition.
            p_wn("config at log idx 1 is not availabe, "
                 "config log idx %" PRIu64 ", prev log idx %" PRIu64
                 ", committed idx %" PRIu64,
                 conf->get_log_idx(), conf->get_prev_log_idx(), committed_idx);
            //ctx_->state_mgr_->system_exit(raft_err::N7_no_config_at_idx_one);
            //::exit(-1);
            //return;
        }

        ulong log_term_to_compact = log_store_->term_at(committed_idx);
        ptr<snapshot> new_snapshot
            ( cs_new<snapshot>(committed_idx, log_term_to_compact, conf) );
        p_in( "create snapshot idx %" PRIu64 " log_term %" PRIu64,
              committed_idx, log_term_to_compact );
        cmd_result<bool>::handler_type handler =
            (cmd_result<bool>::handler_type)
            std::bind( &raft_server::on_snapshot_completed,
                       this,
                       new_snapshot,
                       std::placeholders::_1,
                       std::placeholders::_2 );
        timer_helper tt;
        state_machine_->create_snapshot(*new_snapshot, handler);
        p_in( "create snapshot idx %" PRIu64 " log_term %" PRIu64
              " done: %" PRIu64 " us elapsed",
              committed_idx, log_term_to_compact, tt.get_us() );

        snapshot_in_action = false;
        return true;
    }
    return false;

 } catch (std::exception &e) {
    p_er( "failed to compact logs at index %" PRIu64 " due to errors %s",
          committed_idx, e.what());
    if (snapshot_in_action) {
        bool val = true;
        snp_in_progress_.compare_exchange_strong(val, false);
    }
    return false;
 }
}